

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O1

CRef __thiscall Minisat::Solver::propagate(Solver *this)

{
  uint64_t *puVar1;
  ulong *puVar2;
  byte bVar3;
  Lit LVar4;
  uint uVar5;
  undefined4 uVar6;
  lbool *plVar7;
  uint *puVar8;
  watchItem *pwVar9;
  Watcher WVar10;
  bool bVar11;
  Watcher WVar12;
  byte bVar13;
  int iVar14;
  Watcher *pWVar15;
  Watcher *pWVar16;
  ulong uVar17;
  Watcher *pWVar18;
  Watcher *pWVar19;
  Watcher *pWVar20;
  ulong uVar21;
  int iVar22;
  vec<Minisat::Watcher> *pvVar23;
  uint uVar24;
  long lVar25;
  long lVar26;
  Watcher w;
  uint local_98;
  uint local_94;
  Watcher local_88;
  int local_7c;
  Watcher *local_78;
  Watcher *local_70;
  ulong local_68;
  watchItem local_60;
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted> *local_50;
  vec<Minisat::Solver::watchItem> *local_48;
  vec<Minisat::Watcher> *local_40;
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted> *local_38;
  
  if ((this->lazySATwatch).data != (watchItem *)0x0) {
    (this->lazySATwatch).sz = 0;
  }
  local_48 = &this->lazySATwatch;
  local_50 = &this->watches;
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>::cleanAll
            (local_50);
  local_38 = &this->watches_bin;
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>::cleanAll
            (local_38);
  local_94 = 0xffffffff;
  local_68 = 0;
  local_98 = 0xfffffffe;
  do {
    iVar22 = this->qhead;
    if ((this->trail).sz <= iVar22) break;
    this->qhead = iVar22 + 1;
    uVar24 = (this->trail).data[iVar22].x;
    local_7c = (this->vardata).data[(int)uVar24 >> 1].level;
    local_40 = (this->watches).occs.data + (int)uVar24;
    if (this->use_backuped_trail == true) {
      if (this->old_trail_qhead < (this->old_trail).sz) {
        local_98 = (this->old_trail).data[this->old_trail_qhead].x;
      }
      if (local_98 != 0xfffffffe) {
        if (uVar24 == local_98) {
          iVar22 = this->old_trail_qhead;
          if (iVar22 < (this->old_trail).sz + -1) {
            do {
              this->old_trail_qhead = iVar22 + 1;
              local_98 = (this->old_trail).data[(long)iVar22 + 1].x;
              uVar5 = (this->oldreasons).data[(int)local_98 >> 1];
              uVar17 = (ulong)uVar5;
              if (uVar17 == 0xffffffff) break;
              bVar3 = (this->assigns).data[(int)local_98 >> 1].value;
              if (((byte)local_98 & 1 ^ bVar3) == 1) {
                puVar8 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
                if (((*(ulong *)(puVar8 + uVar17) & 0xfffffffc00000000) == 0x800000000) ||
                   (puVar8[uVar17 + 2] == local_98)) {
                  this->used_backup_lits = this->used_backup_lits + 1;
                  bVar11 = false;
                  local_94 = uVar5;
                }
                else {
                  reset_old_trail(this);
                  bVar11 = true;
                }
                iVar22 = 6;
                if (!bVar11) goto LAB_00114356;
                break;
              }
              if ((bVar3 & 2) != 0) {
                puVar8 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
                if (((*(ulong *)(puVar8 + uVar17) & 0xfffffffc00000000) != 0x800000000) &&
                   (puVar8[uVar17 + 2] != local_98)) goto LAB_00114399;
                this->used_backup_lits = this->used_backup_lits + 1;
                uncheckedEnqueue(this,(Lit)local_98,(this->trail_lim).sz,uVar5);
              }
              iVar22 = this->old_trail_qhead;
            } while (iVar22 < (this->old_trail).sz + -1);
          }
        }
        else if (((int)uVar24 >> 1 == (int)local_98 >> 1) ||
                (((byte)local_98 & 1 ^ (this->assigns).data[(int)local_98 >> 1].value) == 1)) {
LAB_00114399:
          reset_old_trail(this);
        }
      }
    }
    pvVar23 = (local_38->occs).data;
    iVar22 = 7;
    if (0 < pvVar23[(int)uVar24].sz) {
      pvVar23 = pvVar23 + (int)uVar24;
      lVar25 = 0;
      do {
        pWVar20 = pvVar23->data;
        LVar4.x = pWVar20[lVar25].blocker.x;
        bVar3 = (this->assigns).data[LVar4.x >> 1].value;
        bVar13 = (byte)LVar4.x & 1 ^ bVar3;
        if (bVar13 == 1) {
          local_94 = pWVar20[lVar25].cref;
          iVar22 = 6;
        }
        else {
          iVar22 = 0;
          if ((bVar3 & 2) != 0) {
            uncheckedEnqueue(this,LVar4,local_7c,pWVar20[lVar25].cref);
          }
        }
      } while ((bVar13 != 1) && (lVar25 = lVar25 + 1, iVar22 = 7, lVar25 < pvVar23->sz));
    }
    if (iVar22 == 7) {
      pWVar16 = local_40->data;
      pWVar20 = pWVar16;
      if ((long)local_40->sz != 0) {
        pWVar18 = pWVar16 + local_40->sz;
        uVar24 = uVar24 ^ 1;
        pWVar15 = pWVar16;
        pWVar19 = pWVar16;
        local_78 = pWVar18;
        do {
          iVar22 = (pWVar15->blocker).x;
          plVar7 = (this->assigns).data;
          if (plVar7[iVar22 >> 1].value == ((byte)iVar22 & 1)) {
            WVar12 = *pWVar15;
LAB_00113fa3:
            pWVar16 = pWVar15 + 1;
            *pWVar19 = WVar12;
            pWVar20 = pWVar19 + 1;
          }
          else {
            uVar5 = pWVar15->cref;
            puVar8 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
            puVar1 = &(this->statistics).solveSteps;
            *puVar1 = *puVar1 + 1;
            puVar2 = (ulong *)(puVar8 + uVar5);
            if ((uint)puVar2[1] == uVar24) {
              *(undefined4 *)(puVar2 + 1) = *(undefined4 *)((long)puVar2 + 0xc);
              *(uint *)((long)puVar2 + 0xc) = uVar24;
            }
            pWVar16 = pWVar15 + 1;
            LVar4.x = (int)puVar2[1];
            local_88.cref = uVar5;
            local_88.blocker = LVar4;
            if ((LVar4.x != iVar22) && (plVar7[LVar4.x >> 1].value == ((byte)LVar4.x & 1))) {
              WVar12.blocker.x = LVar4.x;
              WVar12.cref = uVar5;
              goto LAB_00113fa3;
            }
            iVar22 = 0;
            if (0xbffffffff < *puVar2) {
              uVar17 = 0;
              uVar21 = 2;
              do {
                iVar22 = (int)puVar8[(ulong)uVar5 + uVar21 + 2] >> 1;
                if (((byte)puVar8[(ulong)uVar5 + uVar21 + 2] & 1 ^ plVar7[iVar22].value) != 1) {
                  if ((this->assumptions).sz < (this->vardata).data[iVar22].level) {
                    iVar22 = (int)uVar21;
                    break;
                  }
                  uVar17 = uVar21 & 0xffffffff;
                }
                iVar22 = (int)uVar17;
                uVar21 = uVar21 + 1;
              } while (*puVar2 >> 0x22 != uVar21);
            }
            local_70 = pWVar19;
            if (iVar22 == 0) {
              pWVar20 = pWVar19 + 1;
              WVar10.blocker.x = LVar4.x;
              WVar10.cref = uVar5;
              *pWVar19 = WVar10;
              plVar7 = (this->assigns).data;
              if (((byte)LVar4.x & 1 ^ plVar7[LVar4.x >> 1].value) == 1) {
                this->qhead = (this->trail).sz;
                for (; pWVar18 = local_78, local_94 = uVar5, pWVar16 < local_78;
                    pWVar16 = pWVar16 + 1) {
                  *pWVar20 = *pWVar16;
                  pWVar20 = pWVar20 + 1;
                }
              }
              else {
                iVar22 = local_7c;
                if (local_7c != (this->trail_lim).sz) {
                  uVar17 = 1;
                  iVar14 = 1;
                  if (0xbffffffff < *puVar2) {
                    uVar21 = 2;
                    do {
                      iVar14 = (this->vardata).data[(int)puVar8[(ulong)uVar5 + uVar21 + 2] >> 1].
                               level;
                      if (iVar22 < iVar14) {
                        uVar17 = uVar21 & 0xffffffff;
                        iVar22 = iVar14;
                      }
                      iVar14 = (int)uVar17;
                      uVar21 = uVar21 + 1;
                    } while (*puVar2 >> 0x22 != uVar21);
                  }
                  if (iVar14 != 1) {
                    uVar6 = *(undefined4 *)((long)puVar2 + 0xc);
                    *(undefined4 *)((long)puVar2 + 0xc) =
                         *(undefined4 *)((long)puVar2 + (long)iVar14 * 4 + 8);
                    *(undefined4 *)((long)puVar2 + (long)iVar14 * 4 + 8) = uVar6;
                    iVar14 = *(int *)((long)puVar2 + 0xc);
                    if (plVar7[iVar14 >> 1].value == ((byte)iVar14 & 1)) {
                      local_60.l.x = *(uint *)((long)puVar2 + 0xc) ^ 1;
                      local_60.w.blocker.x = LVar4.x;
                      local_60.w.cref = uVar5;
                      vec<Minisat::Solver::watchItem>::push(local_48,&local_60);
                      pWVar20 = local_70;
                    }
                    else {
                      vec<Minisat::Watcher>::push
                                ((local_50->occs).data + ((long)iVar14 ^ 1),&local_88);
                      pWVar20 = local_70;
                    }
                  }
                }
                uncheckedEnqueue(this,LVar4,iVar22,uVar5);
                pWVar18 = local_78;
              }
            }
            else {
              *(undefined4 *)((long)puVar2 + 0xc) =
                   *(undefined4 *)((long)puVar2 + (long)iVar22 * 4 + 8);
              *(uint *)((long)puVar2 + (long)iVar22 * 4 + 8) = uVar24;
              iVar22 = *(int *)((long)puVar2 + 0xc);
              if (plVar7[iVar22 >> 1].value == ((byte)iVar22 & 1)) {
                local_60.l.x = *(uint *)((long)puVar2 + 0xc) ^ 1;
                local_60.w.blocker.x = LVar4.x;
                local_60.w.cref = uVar5;
                vec<Minisat::Solver::watchItem>::push(local_48,&local_60);
                pWVar18 = local_78;
                pWVar20 = local_70;
              }
              else {
                vec<Minisat::Watcher>::push((local_50->occs).data + ((long)iVar22 ^ 1),&local_88);
                pWVar18 = local_78;
                pWVar20 = local_70;
              }
            }
          }
          pWVar15 = pWVar16;
          pWVar19 = pWVar20;
        } while (pWVar16 != pWVar18);
      }
      iVar22 = 0;
      iVar14 = (int)((ulong)((long)pWVar16 - (long)pWVar20) >> 3);
      if (0 < iVar14) {
        local_40->sz = local_40->sz - iVar14;
      }
    }
LAB_00114356:
    local_68 = (ulong)((int)local_68 + 1);
  } while (iVar22 == 0);
  if (0 < (this->lazySATwatch).sz) {
    lVar25 = 0;
    lVar26 = 0;
    do {
      pwVar9 = (this->lazySATwatch).data;
      vec<Minisat::Watcher>::push
                ((this->watches).occs.data + *(int *)((long)&(pwVar9->l).x + lVar25),
                 (Watcher *)((long)&(pwVar9->w).cref + lVar25));
      lVar26 = lVar26 + 1;
      lVar25 = lVar25 + 0xc;
    } while (lVar26 < (this->lazySATwatch).sz);
  }
  this->propagations = this->propagations + (long)(int)local_68;
  this->simpDB_props = this->simpDB_props - (long)(int)local_68;
  return local_94;
}

Assistant:

CRef Solver::propagate()
{
    CRef confl = CRef_Undef;
    int num_props = 0;
    lazySATwatch.clear();
    Lit old_trail_top = lit_Undef;
    CRef old_reason = CRef_Undef;
    watches.cleanAll();
    watches_bin.cleanAll();

    while (qhead < trail.size()) {
        Lit p = trail[qhead++]; // 'p' is enqueued fact to propagate.
        int currLevel = level(var(p));
        vec<Watcher> &ws = watches[p];
        Watcher *i, *j, *end;
        num_props++;

        /* begin old trail reconstruction */
        if (use_backuped_trail) {
            if (old_trail_qhead < old_trail.size()) {
                old_trail_top = old_trail[old_trail_qhead];
                old_reason = oldreasons[var(old_trail_top)];
            }
            if (old_trail_top != lit_Undef) {
                if (p == old_trail_top) {
                    while (old_trail_qhead < old_trail.size() - 1) {
                        old_trail_qhead++;
                        old_trail_top = old_trail[old_trail_qhead];
                        old_reason = oldreasons[var(old_trail_top)];
                        if (old_reason == CRef_Undef) {
                            break;
                        } else if (value(old_trail_top) == l_False) {
                            const Clause &new_conflict = ca[old_reason];
                            if (new_conflict.size() != 2 && new_conflict[0] != old_trail_top) {
                                /* We will hit a conflict here, the clause is just not structured correctly yet,
                                nor watched correctly. */
                                reset_old_trail();
                                break;
                            }
                            confl = old_reason;
                            used_backup_lits++;
                            TRACE(std::cout
                                  << "c prop: hit conflict during trail restoring, when trying to propagate literal "
                                  << old_trail_top << " with reason[" << old_reason << "] " << new_conflict << std::endl;);
                            assert((new_conflict.size() == 2 || new_conflict[0] == old_trail_top) &&
                                   "asserting literal is at position 1");
                            /* No need to touch watch lists, we will backtrack this level anyways! */
                            goto propagation_out;
                        } else if (value(old_trail_top) == l_Undef) {
                            Clause &new_conflict = ca[old_reason];
                            if (new_conflict.size() != 2 && new_conflict[0] != old_trail_top) {
                                /* We will use this unit clause, the clause is just not structured correctly yet */
                                reset_old_trail();
                                break;
                            }
                            used_backup_lits++;
                            TRACE(std::cout << "c prop: enqueue literal " << old_trail_top << " with reason["
                                            << old_reason << "] " << ca[old_reason] << std::endl;);
                            assert((ca[old_reason].size() == 2 || ca[old_reason][0] == old_trail_top) &&
                                   "asserting literal is at position 1");
                            uncheckedEnqueue(old_trail_top, decisionLevel(), old_reason);
                        }
                    }
                } else if (var(p) == var(old_trail_top) || value(old_trail_top) == l_False) {
                    reset_old_trail();
                }
            }
        }
        /* end old trail reconstruction */

        vec<Watcher> &ws_bin = watches_bin[p]; // Propagate binary clauses first.
        for (int k = 0; k < ws_bin.size(); k++) {
            Lit the_other = ws_bin[k].blocker;
            if (value(the_other) == l_False) {
                confl = ws_bin[k].cref;
                goto propagation_out;
            } else if (value(the_other) == l_Undef) {
                uncheckedEnqueue(the_other, currLevel, ws_bin[k].cref);
#ifdef PRINT_OUT
                std::cout << "i " << the_other << " l " << currLevel << "\n";
#endif
            }
        }

        for (i = j = (Watcher *)ws, end = i + ws.size(); i != end;) {
            // Try to avoid inspecting the clause:
            const Lit blocker = i->blocker;
            if (value(blocker) == l_True) {
                *j++ = *i++;
                continue;
            }

            // Make sure the false literal is data[1]:
            const CRef cr = i->cref;
            Clause &c = ca[cr];
            statistics.solveSteps++;
            const Lit false_lit = ~p;
            if (c[0] == false_lit) c[0] = c[1], c[1] = false_lit;
            assert(c[1] == false_lit);
            i++;

            // If 0th watch is true, then clause is already satisfied.
            const Lit first = c[0];
            const Watcher w = Watcher(cr, first);
            if (first != blocker && value(first) == l_True) {
                *j++ = w;
                continue;
            }

            // Look for new watch:
            int watchPos = 0, avoidLevel = assumptions.size();
            for (int k = 2; k < c.size(); k++) {
                if (value(c[k]) != l_False) {
                    watchPos = k; /* memorize that we found one literal we can watch */
                    if (level(var(c[k])) > avoidLevel) break;
                }
            }

            /* found a position to watch, watch the clause */
            if (watchPos != 0) {
                c[1] = c[watchPos];
                c[watchPos] = false_lit;
                if (value(c[1]) == l_True) {
                    lazySATwatch.push(watchItem(w, ~c[1]));
                } else {
                    watches[~c[1]].push(w);
                }
                goto NextClause;
            }

            // Did not find watch -- clause is unit under assignment:
            *j++ = w;
            if (value(first) == l_False) {
                confl = cr;
                qhead = trail.size();
                // Copy the remaining watches:
                while (i < end) *j++ = *i++;
            } else {
                if (currLevel == decisionLevel()) {
                    uncheckedEnqueue(first, currLevel, cr);
#ifdef PRINT_OUT
                    std::cout << "i " << first << " l " << currLevel << "\n";
#endif
                } else {
                    int nMaxLevel = currLevel;
                    int nMaxInd = 1;
                    // pass over all the literals in the clause and find the one with the biggest level
                    for (int nInd = 2; nInd < c.size(); ++nInd) {
                        int nLevel = level(var(c[nInd]));
                        if (nLevel > nMaxLevel) {
                            nMaxLevel = nLevel;
                            nMaxInd = nInd;
                        }
                    }

                    if (nMaxInd != 1) {
                        std::swap(c[1], c[nMaxInd]);
                        j--; // undo last watch
                        if (value(c[1]) == l_True) {
                            lazySATwatch.push(watchItem(w, ~c[1]));
                        } else {
                            watches[~c[1]].push(w);
                        }
                    }

                    uncheckedEnqueue(first, nMaxLevel, cr);
#ifdef PRINT_OUT
                    std::cout << "i " << first << " l " << nMaxLevel << "\n";
#endif
                }
            }

        NextClause:;
        }
        ws.shrink(i - j);
    }

propagation_out:;
    /* we still need to re-add the satisfied clauses to their respective watch lists - in order! */
    for (int k = 0; k < lazySATwatch.size(); ++k) {
        watches[lazySATwatch[k].l].push(lazySATwatch[k].w);
    }

    propagations += num_props;
    simpDB_props -= num_props;

    return confl;
}